

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

void google::protobuf::internal::ReflectionOps::Merge(Message *from,Message *to)

{
  MapFieldBase *pMVar1;
  Nullable<const_char_*> pcVar2;
  bool bVar3;
  CppType CVar4;
  int32_t iVar5;
  uint32_t uVar6;
  Message **v1;
  Message **v2;
  char *pcVar7;
  LogMessage *pLVar8;
  Descriptor **v1_00;
  Descriptor **v2_00;
  Descriptor *this;
  Reflection *this_00;
  Reflection *this_01;
  MessageFactory *pMVar9;
  MessageFactory *pMVar10;
  reference ppFVar11;
  int64_t iVar12;
  uint64_t uVar13;
  EnumValueDescriptor *pEVar14;
  Message *pMVar15;
  Reflection *pRVar16;
  Message *pMVar17;
  UnknownFieldSet *pUVar18;
  UnknownFieldSet *other;
  float fVar19;
  double dVar20;
  string_view sVar21;
  Message *from_child_1;
  Message *local_130;
  Message *from_child;
  int local_108;
  int local_104;
  int j;
  int count;
  MapFieldBase *to_field;
  MapFieldBase *from_field;
  FieldDescriptor *field;
  iterator __end2;
  iterator __begin2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  bool is_to_generated;
  bool is_from_generated;
  Reflection *to_reflection;
  Reflection *from_reflection;
  LogMessage local_80;
  Voidify local_69;
  Descriptor *local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Descriptor *descriptor;
  LogMessage local_40;
  Voidify local_29;
  Message *local_28;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Message *to_local;
  Message *from_local;
  
  local_28 = from;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)to;
  to_local = from;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Message_const*>
                 (&local_28);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Message*>
                 ((Message **)&absl_log_internal_check_op_result);
  local_20 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::Message_const*,google::protobuf::Message*>
                       (v1,v2,"&from != to");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar7 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x33,pcVar7);
    pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar8);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  absl_log_internal_check_op_result_1 = (Nullable<const_char_*>)Message::GetDescriptor(to_local);
  local_68 = Message::GetDescriptor((Message *)absl_log_internal_check_op_result);
  v1_00 = absl::lts_20250127::log_internal::
          GetReferenceableValue<google::protobuf::Descriptor_const*>(&local_68);
  v2_00 = absl::lts_20250127::log_internal::
          GetReferenceableValue<google::protobuf::Descriptor_const*>
                    ((Descriptor **)&absl_log_internal_check_op_result_1);
  local_60 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*>
                       (v1_00,v2_00,"to->GetDescriptor() == descriptor");
  if (local_60 != (Nullable<const_char_*>)0x0) {
    pcVar7 = absl::lts_20250127::implicit_cast<char_const*>(local_60);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x36,pcVar7);
    pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
    pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar8,(char (*) [44])"Tried to merge messages of different types ");
    pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar8,(char (*) [8])"(merge ");
    sVar21 = Descriptor::full_name((Descriptor *)absl_log_internal_check_op_result_1);
    pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,sVar21);
    pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,(char (*) [5])" to ");
    this = Message::GetDescriptor((Message *)absl_log_internal_check_op_result);
    sVar21 = Descriptor::full_name(this);
    pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,sVar21);
    pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar8,(char (*) [2])0x6a5878)
    ;
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar8);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_80);
  }
  this_00 = GetReflectionOrDie(to_local);
  this_01 = GetReflectionOrDie((Message *)absl_log_internal_check_op_result);
  pMVar9 = Reflection::GetMessageFactory(this_00);
  pMVar10 = MessageFactory::generated_factory();
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = pMVar9 == pMVar10;
  pMVar9 = Reflection::GetMessageFactory(this_01);
  pMVar10 = MessageFactory::generated_factory();
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = pMVar9 == pMVar10;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)&__range2);
  Reflection::ListFields
            (this_00,to_local,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&__range2);
  __end2 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)&__range2);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)&__range2);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&field);
    if (!bVar3) {
      pUVar18 = Reflection::GetUnknownFields(this_00,to_local);
      bVar3 = UnknownFieldSet::empty(pUVar18);
      if (!bVar3) {
        pUVar18 = Reflection::MutableUnknownFields
                            (this_01,(Message *)absl_log_internal_check_op_result);
        other = Reflection::GetUnknownFields(this_00,to_local);
        UnknownFieldSet::MergeFrom(pUVar18,other);
      }
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)&__range2);
      return;
    }
    ppFVar11 = __gnu_cxx::
               __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
               ::operator*(&__end2);
    from_field = (MapFieldBase *)*ppFVar11;
    bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)from_field);
    if (bVar3) {
      if (((fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) ==
           (fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1)) &&
         (bVar3 = FieldDescriptor::is_map((FieldDescriptor *)from_field), bVar3)) {
        to_field = Reflection::GetMapData(this_00,to_local,(FieldDescriptor *)from_field);
        _j = Reflection::MutableMapData
                       (this_01,(Message *)absl_log_internal_check_op_result,
                        (FieldDescriptor *)from_field);
        bVar3 = MapFieldBase::IsMapValid(_j);
        if ((bVar3) && (bVar3 = MapFieldBase::IsMapValid(to_field), bVar3)) {
          MapFieldBase::MergeFrom(_j,to_field);
          goto switchD_004290ab_default;
        }
      }
      local_104 = Reflection::FieldSize(this_00,to_local,(FieldDescriptor *)from_field);
      for (local_108 = 0; local_108 < local_104; local_108 = local_108 + 1) {
        CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)from_field);
        pcVar2 = absl_log_internal_check_op_result;
        pMVar1 = from_field;
        switch(CVar4) {
        case CPPTYPE_INT32:
          iVar5 = Reflection::GetRepeatedInt32
                            (this_00,to_local,(FieldDescriptor *)from_field,local_108);
          Reflection::AddInt32(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,iVar5);
          break;
        case CPPTYPE_INT64:
          iVar12 = Reflection::GetRepeatedInt64
                             (this_00,to_local,(FieldDescriptor *)from_field,local_108);
          Reflection::AddInt64(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,iVar12);
          break;
        case CPPTYPE_UINT32:
          uVar6 = Reflection::GetRepeatedUInt32
                            (this_00,to_local,(FieldDescriptor *)from_field,local_108);
          Reflection::AddUInt32(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,uVar6);
          break;
        case CPPTYPE_UINT64:
          uVar13 = Reflection::GetRepeatedUInt64
                             (this_00,to_local,(FieldDescriptor *)from_field,local_108);
          Reflection::AddUInt64(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,uVar13);
          break;
        case CPPTYPE_DOUBLE:
          dVar20 = Reflection::GetRepeatedDouble
                             (this_00,to_local,(FieldDescriptor *)from_field,local_108);
          Reflection::AddDouble(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,dVar20);
          break;
        case CPPTYPE_FLOAT:
          fVar19 = Reflection::GetRepeatedFloat
                             (this_00,to_local,(FieldDescriptor *)from_field,local_108);
          Reflection::AddFloat(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,fVar19);
          break;
        case CPPTYPE_BOOL:
          bVar3 = Reflection::GetRepeatedBool
                            (this_00,to_local,(FieldDescriptor *)from_field,local_108);
          Reflection::AddBool(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,bVar3);
          break;
        case CPPTYPE_ENUM:
          pEVar14 = Reflection::GetRepeatedEnum
                              (this_00,to_local,(FieldDescriptor *)from_field,local_108);
          Reflection::AddEnum(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,pEVar14);
          break;
        case CPPTYPE_STRING:
          Reflection::GetRepeatedString_abi_cxx11_
                    ((string *)&from_child,this_00,to_local,(FieldDescriptor *)from_field,local_108)
          ;
          Reflection::AddString
                    (this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,(string *)&from_child);
          std::__cxx11::string::~string((string *)&from_child);
          break;
        case CPPTYPE_MESSAGE:
          local_130 = Reflection::GetRepeatedMessage
                                (this_00,to_local,(FieldDescriptor *)from_field,local_108);
          pcVar2 = absl_log_internal_check_op_result;
          pMVar1 = from_field;
          if (this_00 == this_01) {
            pRVar16 = Message::GetReflection(local_130);
            pMVar9 = Reflection::GetMessageFactory(pRVar16);
            pMVar15 = Reflection::AddMessage
                                (this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,pMVar9);
            Message::MergeFrom(pMVar15,local_130);
          }
          else {
            pMVar15 = Reflection::AddMessage
                                (this_01,(Message *)absl_log_internal_check_op_result,
                                 (FieldDescriptor *)from_field,(MessageFactory *)0x0);
            Message::MergeFrom(pMVar15,local_130);
          }
        }
      }
    }
    else {
      CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)from_field);
      pcVar2 = absl_log_internal_check_op_result;
      pMVar1 = from_field;
      switch(CVar4) {
      case CPPTYPE_INT32:
        iVar5 = Reflection::GetInt32(this_00,to_local,(FieldDescriptor *)from_field);
        Reflection::SetInt32(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,iVar5);
        break;
      case CPPTYPE_INT64:
        iVar12 = Reflection::GetInt64(this_00,to_local,(FieldDescriptor *)from_field);
        Reflection::SetInt64(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,iVar12);
        break;
      case CPPTYPE_UINT32:
        uVar6 = Reflection::GetUInt32(this_00,to_local,(FieldDescriptor *)from_field);
        Reflection::SetUInt32(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,uVar6);
        break;
      case CPPTYPE_UINT64:
        uVar13 = Reflection::GetUInt64(this_00,to_local,(FieldDescriptor *)from_field);
        Reflection::SetUInt64(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,uVar13);
        break;
      case CPPTYPE_DOUBLE:
        dVar20 = Reflection::GetDouble(this_00,to_local,(FieldDescriptor *)from_field);
        Reflection::SetDouble(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,dVar20);
        break;
      case CPPTYPE_FLOAT:
        fVar19 = Reflection::GetFloat(this_00,to_local,(FieldDescriptor *)from_field);
        Reflection::SetFloat(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,fVar19);
        break;
      case CPPTYPE_BOOL:
        bVar3 = Reflection::GetBool(this_00,to_local,(FieldDescriptor *)from_field);
        Reflection::SetBool(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,bVar3);
        break;
      case CPPTYPE_ENUM:
        pEVar14 = Reflection::GetEnum(this_00,to_local,(FieldDescriptor *)from_field);
        Reflection::SetEnum(this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,pEVar14);
        break;
      case CPPTYPE_STRING:
        Reflection::GetString_abi_cxx11_
                  ((string *)&from_child_1,this_00,to_local,(FieldDescriptor *)from_field);
        Reflection::SetString
                  (this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,(string *)&from_child_1);
        std::__cxx11::string::~string((string *)&from_child_1);
        break;
      case CPPTYPE_MESSAGE:
        pMVar15 = Reflection::GetMessage
                            (this_00,to_local,(FieldDescriptor *)from_field,(MessageFactory *)0x0);
        pcVar2 = absl_log_internal_check_op_result;
        pMVar1 = from_field;
        if (this_00 == this_01) {
          pRVar16 = Message::GetReflection(pMVar15);
          pMVar9 = Reflection::GetMessageFactory(pRVar16);
          pMVar17 = Reflection::MutableMessage
                              (this_01,(Message *)pcVar2,(FieldDescriptor *)pMVar1,pMVar9);
          Message::MergeFrom(pMVar17,pMVar15);
        }
        else {
          pMVar17 = Reflection::MutableMessage
                              (this_01,(Message *)absl_log_internal_check_op_result,
                               (FieldDescriptor *)from_field,(MessageFactory *)0x0);
          Message::MergeFrom(pMVar17,pMVar15);
        }
      }
    }
switchD_004290ab_default:
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void ReflectionOps::Merge(const Message& from, Message* to) {
  ABSL_CHECK_NE(&from, to);

  const Descriptor* descriptor = from.GetDescriptor();
  ABSL_CHECK_EQ(to->GetDescriptor(), descriptor)
      << "Tried to merge messages of different types "
      << "(merge " << descriptor->full_name() << " to "
      << to->GetDescriptor()->full_name() << ")";

  const Reflection* from_reflection = GetReflectionOrDie(from);
  const Reflection* to_reflection = GetReflectionOrDie(*to);
  bool is_from_generated = (from_reflection->GetMessageFactory() ==
                            google::protobuf::MessageFactory::generated_factory());
  bool is_to_generated = (to_reflection->GetMessageFactory() ==
                          google::protobuf::MessageFactory::generated_factory());

  std::vector<const FieldDescriptor*> fields;
  from_reflection->ListFields(from, &fields);
  for (const FieldDescriptor* field : fields) {
    if (field->is_repeated()) {
      // Use map reflection if both are in map status and have the
      // same map type to avoid sync with repeated field.
      // Note: As from and to messages have the same descriptor, the
      // map field types are the same if they are both generated
      // messages or both dynamic messages.
      if (is_from_generated == is_to_generated && field->is_map()) {
        const MapFieldBase* from_field =
            from_reflection->GetMapData(from, field);
        MapFieldBase* to_field = to_reflection->MutableMapData(to, field);
        if (to_field->IsMapValid() && from_field->IsMapValid()) {
          to_field->MergeFrom(*from_field);
          continue;
        }
      }
      int count = from_reflection->FieldSize(from, field);
      for (int j = 0; j < count; j++) {
        switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                \
    to_reflection->Add##METHOD(                                           \
        to, field, from_reflection->GetRepeated##METHOD(from, field, j)); \
    break;

          HANDLE_TYPE(INT32, Int32);
          HANDLE_TYPE(INT64, Int64);
          HANDLE_TYPE(UINT32, UInt32);
          HANDLE_TYPE(UINT64, UInt64);
          HANDLE_TYPE(FLOAT, Float);
          HANDLE_TYPE(DOUBLE, Double);
          HANDLE_TYPE(BOOL, Bool);
          HANDLE_TYPE(STRING, String);
          HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

          case FieldDescriptor::CPPTYPE_MESSAGE:
            const Message& from_child =
                from_reflection->GetRepeatedMessage(from, field, j);
            if (from_reflection == to_reflection) {
              to_reflection
                  ->AddMessage(to, field,
                               from_child.GetReflection()->GetMessageFactory())
                  ->MergeFrom(from_child);
            } else {
              to_reflection->AddMessage(to, field)->MergeFrom(from_child);
            }
            break;
        }
      }
    } else {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                       \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                 \
    to_reflection->Set##METHOD(to, field,                                  \
                               from_reflection->Get##METHOD(from, field)); \
    break;

        HANDLE_TYPE(INT32, Int32);
        HANDLE_TYPE(INT64, Int64);
        HANDLE_TYPE(UINT32, UInt32);
        HANDLE_TYPE(UINT64, UInt64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
        HANDLE_TYPE(STRING, String);
        HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_MESSAGE:
          const Message& from_child = from_reflection->GetMessage(from, field);
          if (from_reflection == to_reflection) {
            to_reflection
                ->MutableMessage(
                    to, field, from_child.GetReflection()->GetMessageFactory())
                ->MergeFrom(from_child);
          } else {
            to_reflection->MutableMessage(to, field)->MergeFrom(from_child);
          }
          break;
      }
    }
  }

  if (!from_reflection->GetUnknownFields(from).empty()) {
    to_reflection->MutableUnknownFields(to)->MergeFrom(
        from_reflection->GetUnknownFields(from));
  }
}